

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O2

uint32_t anon_unknown.dwarf_40a80b8::DecodeBits
                   (const_iterator *bitpos,const_iterator *endpos,uint8_t minval,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *bit_sizes)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  byte *pbVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  char cVar7;
  uint32_t uVar8;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  long in_FS_OFFSET;
  
  uVar9 = CONCAT71(in_register_00000011,minval) & 0xffffffff;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar11 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  while (pbVar4 = (bit_sizes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish, pbVar11 != pbVar4) {
    if (pbVar11 + 1 == pbVar4) {
LAB_00aec81b:
      bVar1 = *pbVar11;
      uVar10 = 0;
      cVar7 = -1;
      goto LAB_00aec824;
    }
    puVar5 = (bitpos->super__Bit_iterator_base)._M_p;
    uVar10 = (bitpos->super__Bit_iterator_base)._M_offset;
    if ((puVar5 == (endpos->super__Bit_iterator_base)._M_p) &&
       (uVar10 == (endpos->super__Bit_iterator_base)._M_offset)) break;
    uVar6 = *puVar5;
    std::_Bit_const_iterator::operator++(bitpos,0);
    if ((uVar6 >> ((ulong)uVar10 & 0x3f) & 1) == 0) goto LAB_00aec81b;
    uVar9 = (ulong)(uint)((int)uVar9 + (1 << (*pbVar11 & 0x1f)));
    pbVar11 = pbVar11 + 1;
  }
LAB_00aec86e:
  uVar8 = 0xffffffff;
LAB_00aec871:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return uVar8;
  }
  __stack_chk_fail();
LAB_00aec824:
  uVar8 = (uint32_t)uVar9;
  if (bVar1 <= uVar10) goto LAB_00aec871;
  puVar5 = (bitpos->super__Bit_iterator_base)._M_p;
  uVar2 = (bitpos->super__Bit_iterator_base)._M_offset;
  if ((puVar5 == (endpos->super__Bit_iterator_base)._M_p) &&
     (uVar2 == (endpos->super__Bit_iterator_base)._M_offset)) goto LAB_00aec86e;
  uVar9 = *puVar5;
  std::_Bit_const_iterator::operator++(bitpos,0);
  bVar1 = *pbVar11;
  uVar9 = (ulong)(uVar8 + ((uint)((uVar9 >> ((ulong)uVar2 & 0x3f) & 1) != 0) <<
                          (bVar1 + cVar7 & 0x1f)));
  uVar10 = uVar10 + 1;
  cVar7 = cVar7 + -1;
  goto LAB_00aec824;
}

Assistant:

uint32_t DecodeBits(std::vector<bool>::const_iterator& bitpos, const std::vector<bool>::const_iterator& endpos, uint8_t minval, const std::vector<uint8_t> &bit_sizes)
{
    uint32_t val = minval;
    bool bit;
    for (std::vector<uint8_t>::const_iterator bit_sizes_it = bit_sizes.begin();
        bit_sizes_it != bit_sizes.end(); ++bit_sizes_it) {
        if (bit_sizes_it + 1 != bit_sizes.end()) {
            if (bitpos == endpos) break;
            bit = *bitpos;
            bitpos++;
        } else {
            bit = 0;
        }
        if (bit) {
            val += (1 << *bit_sizes_it);
        } else {
            for (int b = 0; b < *bit_sizes_it; b++) {
                if (bitpos == endpos) return INVALID; // Reached EOF in mantissa
                bit = *bitpos;
                bitpos++;
                val += bit << (*bit_sizes_it - 1 - b);
            }
            return val;
        }
    }
    return INVALID; // Reached EOF in exponent
}